

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

uint __thiscall
Imath_3_2::Box<Imath_3_2::Vec4<double>_>::majorAxis(Box<Imath_3_2::Vec4<double>_> *this)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  uint i;
  Vec4<double> s;
  uint major;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar4;
  uint i_00;
  Vec4<double> local_30;
  uint local_c;
  
  local_c = 0;
  size((Box<Imath_3_2::Vec4<double>_> *)
       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  uVar4 = 1;
  while( true ) {
    i_00 = uVar4;
    uVar2 = Vec4<double>::dimensions();
    if (uVar2 <= uVar4) break;
    pdVar3 = Vec4<double>::operator[](&local_30,i_00);
    dVar1 = *pdVar3;
    pdVar3 = Vec4<double>::operator[](&local_30,local_c);
    if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
      local_c = i_00;
    }
    uVar4 = i_00 + 1;
  }
  return local_c;
}

Assistant:

unsigned int
Box<V>::majorAxis () const IMATH_NOEXCEPT
{
    unsigned int major = 0;
    V            s     = size ();

    for (unsigned int i = 1; i < min.dimensions (); i++)
    {
        if (s[i] > s[major]) major = i;
    }

    return major;
}